

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cascade.cpp
# Opt level: O1

vector<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_> * __thiscall
Iir::Cascade::getPoleZeros
          (vector<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_> *__return_storage_ptr__,
          Cascade *this)

{
  iterator __position;
  int iVar1;
  Biquad *s;
  BiquadPoleState bps;
  BiquadPoleState local_68;
  
  (__return_storage_ptr__->super__Vector_base<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_>::reserve
            (__return_storage_ptr__,(long)this->m_numStages);
  if (0 < this->m_numStages) {
    s = this->m_stageArray;
    iVar1 = this->m_numStages + 1;
    do {
      BiquadPoleState::BiquadPoleState(&local_68,s);
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Iir::PoleZeroPair,std::allocator<Iir::PoleZeroPair>>::
        _M_realloc_insert<Iir::PoleZeroPair_const&>
                  ((vector<Iir::PoleZeroPair,std::allocator<Iir::PoleZeroPair>> *)
                   __return_storage_ptr__,__position,&local_68.super_PoleZeroPair);
      }
      else {
        *(undefined8 *)((__position._M_current)->zeros).super_complex_pair_t.second._M_value =
             local_68.super_PoleZeroPair.zeros.super_complex_pair_t.second._M_value._0_8_;
        *(undefined8 *)(((__position._M_current)->zeros).super_complex_pair_t.second._M_value + 8) =
             local_68.super_PoleZeroPair.zeros.super_complex_pair_t.second._M_value._8_8_;
        *(undefined8 *)((__position._M_current)->zeros).super_complex_pair_t.first._M_value =
             local_68.super_PoleZeroPair.zeros.super_complex_pair_t.first._M_value._0_8_;
        *(undefined8 *)(((__position._M_current)->zeros).super_complex_pair_t.first._M_value + 8) =
             local_68.super_PoleZeroPair.zeros.super_complex_pair_t.first._M_value._8_8_;
        *(undefined8 *)((__position._M_current)->poles).super_complex_pair_t.second._M_value =
             local_68.super_PoleZeroPair.poles.super_complex_pair_t.second._M_value._0_8_;
        *(undefined8 *)(((__position._M_current)->poles).super_complex_pair_t.second._M_value + 8) =
             local_68.super_PoleZeroPair.poles.super_complex_pair_t.second._M_value._8_8_;
        *(undefined8 *)((__position._M_current)->poles).super_complex_pair_t.first._M_value =
             local_68.super_PoleZeroPair.poles.super_complex_pair_t.first._M_value._0_8_;
        *(undefined8 *)(((__position._M_current)->poles).super_complex_pair_t.first._M_value + 8) =
             local_68.super_PoleZeroPair.poles.super_complex_pair_t.first._M_value._8_8_;
        (__return_storage_ptr__->
        super__Vector_base<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      s = s + 1;
      iVar1 = iVar1 + -1;
    } while (1 < iVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<PoleZeroPair> Cascade::getPoleZeros () const
	{
		std::vector<PoleZeroPair> vpz;
		vpz.reserve ((unsigned long)m_numStages);

		const Biquad* stage = m_stageArray;
		for (int i = m_numStages; --i >=0;)
		{
			BiquadPoleState bps (*stage++);
			vpz.push_back (bps);
		}

		return vpz;
	}